

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::RNEMD::writeOutputFile(RNEMD *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ofstream *o;
  ulong uVar2;
  pointer pOVar3;
  RealType RVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  char cVar8;
  uint i;
  int iVar9;
  long lVar10;
  ostream *poVar11;
  pointer ppAVar12;
  long *plVar13;
  undefined8 *puVar14;
  uint uVar15;
  ulong *puVar16;
  ulong uVar17;
  uint i_3;
  char *pcVar18;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  uint i_2;
  ulong uVar22;
  char *pcVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  double dVar26;
  Vector<double,_3U> result;
  string __str;
  vector<int,_std::allocator<int>_> nonEmptyAccumulators;
  int worldRank;
  string local_128;
  ulong *local_108;
  uint local_100;
  undefined4 uStack_fc;
  ulong local_f8 [2];
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  double dStack_a0;
  vector<int,_std::allocator<int>_> local_90;
  string *local_78;
  int local_6c;
  Vector<double,_3U> local_68;
  Vector<double,_3U> local_48;
  
  if (((this->doRNEMD_ == true) && (this->hasData_ == true)) &&
     (MPI_Comm_rank(&ompi_mpi_comm_world,&local_6c), local_6c == 0)) {
    o = &this->rnemdFile_;
    std::ofstream::open((char *)o,(_Ios_Openmode)(this->rnemdFileName_)._M_dataplus._M_p);
    if ((*(byte *)((long)(&this->angularMomentumFluxVector_ + 4) +
                  *(long *)(*(long *)&this->rnemdFile_ + -0x18) + 0x10) & 5) != 0) {
      snprintf(painCave.errMsg,2000,"Could not open \"%s\" for RNEMD output.\n");
      painCave.isFatal = 1;
      simError();
    }
    RVar4 = Snapshot::getTime(this->currentSnap_);
    local_48.data_[2] = (double)OpenMD::V3Zero._16_8_;
    local_48.data_[0] = (double)OpenMD::V3Zero._0_8_;
    local_48.data_[1] = (double)OpenMD::V3Zero._8_8_;
    local_68.data_[2] = (double)OpenMD::V3Zero._16_8_;
    local_68.data_[0] = (double)OpenMD::V3Zero._0_8_;
    local_68.data_[1] = (double)OpenMD::V3Zero._8_8_;
    _local_a8 = ZEXT816(0);
    if ((this->info_->simParams_->Dt).data_ <= RVar4) {
      dVar26 = (this->areaAccumulator_).Avg_ * RVar4;
      auVar25._0_8_ = this->kineticExchange_ / dVar26;
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      lVar10 = 0;
      do {
        (&local_128._M_dataplus)[lVar10]._M_p =
             (pointer)((this->momentumExchange_).super_Vector<double,_3U>.data_[lVar10] / dVar26);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_48.data_[2] = (double)local_128.field_2._M_allocated_capacity;
      local_48.data_[0] = (double)local_128._M_dataplus._M_p;
      local_48.data_[1] = (double)local_128._M_string_length;
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      lVar10 = 0;
      do {
        (&local_128._M_dataplus)[lVar10]._M_p =
             (pointer)((this->angularMomentumExchange_).super_Vector<double,_3U>.data_[lVar10] /
                      dVar26);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_68.data_[2] = (double)local_128.field_2._M_allocated_capacity;
      local_68.data_[0] = (double)local_128._M_dataplus._M_p;
      local_68.data_[1] = (double)local_128._M_string_length;
      auVar25._8_8_ = this->particleExchange_;
      auVar5._8_4_ = SUB84(dVar26,0);
      auVar5._0_8_ = 0x3f3b6b96510fbd0c;
      auVar5._12_4_ = (int)((ulong)dVar26 >> 0x20);
      _local_a8 = divpd(auVar25,auVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#######################################################\n",0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"# RNEMD {\n",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#    exchangeMethod  = \"",0x18);
    local_78 = &this->rnemdMethodLabel_;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)o,(this->rnemdMethodLabel_)._M_dataplus._M_p,
                         (this->rnemdMethodLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\";\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#    fluxType  = \"",0x12);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)o,(this->rnemdFluxTypeLabel_)._M_dataplus._M_p,
                         (this->rnemdFluxTypeLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\";\n",3);
    if (this->usePeriodicBoundaryConditions_ == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#    privilegedAxis = ",0x16)
      ;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)o,(this->rnemdAxisLabel_)._M_dataplus._M_p,
                           (this->rnemdAxisLabel_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\n",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#    exchangeTime = ",0x14);
    poVar11 = std::ostream::_M_insert<double>(this->exchangeTime_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#    objectSelection = \"",0x18);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)o,(this->rnemdObjectSelection_)._M_dataplus._M_p,
                         (this->rnemdObjectSelection_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\";\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#    selectionA = \"",0x13);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)o,(this->selectionA_)._M_dataplus._M_p,
                         (this->selectionA_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\";\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#    selectionB = \"",0x13);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)o,(this->selectionB_)._M_dataplus._M_p,
                         (this->selectionB_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\";\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#    outputSelection = \"",0x18);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)o,(this->outputSelection_)._M_dataplus._M_p,
                         (this->outputSelection_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\";\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"# }\n",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#######################################################\n",0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"# RNEMD report:\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#      running time = ",0x16);
    poVar11 = std::ostream::_M_insert<double>(RVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," fs\n",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"# Target flux:\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#           kinetic = ",0x16);
    poVar11 = std::ostream::_M_insert<double>(this->kineticFlux_ / 0.0004184);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (kcal/mol/A^2/fs)\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#          momentum = ",0x16);
    poVar11 = OpenMD::operator<<((ostream *)o,&(this->momentumFluxVector_).super_Vector<double,_3U>)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (amu/A/fs^2)\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#  angular momentum = ",0x16);
    poVar11 = OpenMD::operator<<((ostream *)o,
                                 &(this->angularMomentumFluxVector_).super_Vector<double,_3U>);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (amu/A^2/fs^2)\n",0x10);
    pcVar23 = "#          particle = ";
    bVar24 = this->useChargedSPF_ != false;
    pcVar18 = "#          particle = ";
    if (bVar24) {
      pcVar18 = "#   current density = ";
    }
    pcVar20 = " (particles/A^2/fs)\n";
    if (bVar24) {
      pcVar20 = " (electrons/A^2/fs)\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,pcVar18,0x16);
    poVar11 = std::ostream::_M_insert<double>(this->particleFlux_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar20,0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"# Target one-time exchanges:\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#          kinetic = ",0x15);
    poVar11 = std::ostream::_M_insert<double>(this->kineticTarget_ / 0.0004184);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (kcal/mol)\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#          momentum = ",0x16);
    poVar11 = OpenMD::operator<<((ostream *)o,&(this->momentumTarget_).super_Vector<double,_3U>);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (amu*A/fs)\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#  angular momentum = ",0x16);
    poVar11 = OpenMD::operator<<((ostream *)o,
                                 &(this->angularMomentumTarget_).super_Vector<double,_3U>);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (amu*A^2/fs)\n",0xe);
    bVar24 = this->useChargedSPF_ != false;
    pcVar18 = "#          particle = ";
    if (bVar24) {
      pcVar18 = "#   current density = ";
    }
    pcVar20 = " (particles)\n";
    pcVar21 = " (particles)\n";
    if (bVar24) {
      pcVar21 = " (electrons)\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,pcVar18,0x16);
    poVar11 = std::ostream::_M_insert<double>(this->particleTarget_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar21,0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"# Actual exchange totals:\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#          kinetic = ",0x15);
    poVar11 = std::ostream::_M_insert<double>(this->kineticExchange_ / 0.0004184);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (kcal/mol)\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#          momentum = ",0x16);
    poVar11 = OpenMD::operator<<((ostream *)o,&(this->momentumExchange_).super_Vector<double,_3U>);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (amu*A/fs)\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#  angular momentum = ",0x16);
    poVar11 = OpenMD::operator<<((ostream *)o,
                                 &(this->angularMomentumExchange_).super_Vector<double,_3U>);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (amu*A^2/fs)\n",0xe);
    pcVar18 = "#          particle = ";
    if (this->useChargedSPF_ != false) {
      pcVar18 = "#   current density = ";
      pcVar20 = " (electrons)\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,pcVar18,0x16);
    poVar11 = std::ostream::_M_insert<double>(this->particleExchange_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar20,0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"# Actual flux:\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#          kinetic = ",0x15);
    poVar11 = std::ostream::_M_insert<double>((double)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (kcal/mol/A^2/fs)\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#          momentum = ",0x16);
    poVar11 = OpenMD::operator<<((ostream *)o,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (amu/A/fs^2)\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#  angular momentum = ",0x16);
    poVar11 = OpenMD::operator<<((ostream *)o,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (amu/A^2/fs^2)\n",0x10);
    bVar24 = this->useChargedSPF_ != false;
    if (bVar24) {
      pcVar23 = "#   current density = ";
    }
    pcVar18 = " (particles/A^2/fs)\n";
    if (bVar24) {
      pcVar18 = " (electrons/A^2/fs)\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,pcVar23,0x16);
    poVar11 = std::ostream::_M_insert<double>(dStack_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar18,0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"# Exchange statistics:\n",0x17)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#               attempted = ",0x1c);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)o);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#                  failed = ",0x1c);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)o);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    iVar9 = std::__cxx11::string::compare((char *)local_78);
    if (iVar9 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)o,"#  NIVS root-check errors = ",0x1c);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#######################################################\n",0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#",1);
    uVar22 = 0;
    do {
      if (((this->outputMask_).super__Base_bitset<1UL>._M_w >> (uVar22 & 0x3f) & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"\t",1);
        pOVar3 = (this->data_).
                 super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)o,pOVar3[uVar22].title._M_dataplus._M_p,
                             pOVar3[uVar22].title._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(",1);
        pOVar3 = (this->data_).
                 super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,pOVar3[uVar22].units._M_dataplus._M_p,
                             pOVar3[uVar22].units._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
        lVar10 = (**(code **)(*(long *)**(undefined8 **)
                                         &(this->data_).
                                          super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                          accumulator.
                                          super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                          ._M_impl + 0x38))();
        pcVar18 = *(char **)(lVar10 + 8);
        if ((pcVar18 == "N6OpenMD7Vector3IdEE") ||
           ((*pcVar18 != '*' && (iVar9 = strcmp(pcVar18,"N6OpenMD7Vector3IdEE"), iVar9 == 0)))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"\t\t",2);
        }
        lVar10 = (**(code **)(*(long *)**(undefined8 **)
                                         &(this->data_).
                                          super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                          accumulator.
                                          super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                          ._M_impl + 0x38))();
        pcVar18 = *(char **)(lVar10 + 8);
        if ((pcVar18 == "St6vectorIdSaIdEE") ||
           ((*pcVar18 != '*' && (iVar9 = strcmp(pcVar18,"St6vectorIdSaIdEE"), iVar9 == 0)))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"(",1);
          ppAVar12 = (this->outputTypes_).
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if ((this->outputTypes_).
              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
              super__Vector_impl_data._M_finish != ppAVar12) {
            uVar19 = 0;
            uVar17 = 1;
            do {
              AtomType::getName_abi_cxx11_(&local_128,ppAVar12[uVar19]);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)o,local_128._M_dataplus._M_p,
                                   local_128._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
              ppAVar12 = (this->outputTypes_).
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar24 = uVar17 < (ulong)((long)(this->outputTypes_).
                                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppAVar12 >> 3);
              uVar19 = uVar17;
              uVar17 = (ulong)((int)uVar17 + 1);
            } while (bVar24);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,")\t",2);
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != 9);
    local_128._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,(char *)&local_128,1);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_90,(ulong)this->nBins_,(allocator_type *)&local_128);
    uVar22 = 0;
    auVar6._12_4_ = 0;
    auVar6._0_12_ = stack0xffffffffffffff5c;
    _local_a8 = auVar6 << 0x20;
    do {
      if (((this->outputMask_).super__Base_bitset<1UL>._M_w >> (uVar22 & 0x3f) & 1) != 0) {
        if (this->nBins_ != 0) {
          uVar19 = 0;
          do {
            lVar10 = (**(code **)(**(long **)(*(long *)&(this->data_).
                                                                                                                
                                                  super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                                  accumulator.
                                                  super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                                  ._M_impl + uVar19 * 8) + 0x40))();
            local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar19] =
                 (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19] + 1) - (uint)(lVar10 == 0);
            uVar19 = uVar19 + 1;
          } while (uVar19 < this->nBins_);
        }
        local_a8._0_4_ = local_a8._0_4_ + 1;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != 9);
    *(undefined8 *)
     ((long)(&this->angularMomentumFluxVector_ + 3) +
     *(long *)(*(long *)&this->rnemdFile_ + -0x18) + 0x10) = 8;
    if (this->nBins_ != 0) {
      uVar22 = 0;
      do {
        if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar22] == local_a8._0_4_) {
          uVar19 = 0;
          do {
            if (((this->outputMask_).super__Base_bitset<1UL>._M_w >> (uVar19 & 0x3f) & 1) != 0) {
              std::operator+(&local_c8,"RNEMD detected a numerical error writing: ",
                             &(this->data_).
                              super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19].title);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_c8);
              puVar16 = (ulong *)(plVar13 + 2);
              if ((ulong *)*plVar13 == puVar16) {
                local_d8 = *puVar16;
                lStack_d0 = plVar13[3];
                local_e8 = &local_d8;
              }
              else {
                local_d8 = *puVar16;
                local_e8 = (ulong *)*plVar13;
              }
              local_e0 = plVar13[1];
              *plVar13 = (long)puVar16;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              cVar8 = '\x01';
              if (9 < uVar22) {
                uVar17 = uVar22;
                cVar7 = '\x04';
                do {
                  cVar8 = cVar7;
                  uVar15 = (uint)uVar17;
                  if (uVar15 < 100) {
                    cVar8 = cVar8 + -2;
                    goto LAB_0027cb20;
                  }
                  if (uVar15 < 1000) {
                    cVar8 = cVar8 + -1;
                    goto LAB_0027cb20;
                  }
                  if (uVar15 < 10000) goto LAB_0027cb20;
                  uVar17 = (uVar17 & 0xffffffff) / 10000;
                  cVar7 = cVar8 + '\x04';
                } while (99999 < uVar15);
                cVar8 = cVar8 + '\x01';
              }
LAB_0027cb20:
              local_108 = local_f8;
              std::__cxx11::string::_M_construct((ulong)&local_108,cVar8);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_108,local_100,(uint)uVar22);
              uVar17 = 0xf;
              if (local_e8 != &local_d8) {
                uVar17 = local_d8;
              }
              uVar2 = CONCAT44(uStack_fc,local_100) + local_e0;
              if (uVar17 < uVar2) {
                uVar17 = 0xf;
                if (local_108 != local_f8) {
                  uVar17 = local_f8[0];
                }
                if (uVar17 < uVar2) goto LAB_0027cb8b;
                puVar14 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
              }
              else {
LAB_0027cb8b:
                puVar14 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108);
              }
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 == paVar1) {
                local_128.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                local_128.field_2._8_8_ = puVar14[3];
              }
              else {
                local_128.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                local_128._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_128._M_string_length = puVar14[1];
              *puVar14 = paVar1;
              puVar14[1] = 0;
              paVar1->_M_local_buf[0] = '\0';
              if (local_108 != local_f8) {
                operator_delete(local_108,local_f8[0] + 1);
              }
              if (local_e8 != &local_d8) {
                operator_delete(local_e8,local_d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              plVar13 = *(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl + uVar22 * 8);
              (**(code **)(*plVar13 + 0x48))(plVar13,o,&local_128,0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != 9);
          local_128._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,(char *)&local_128,1);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < this->nBins_);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#######################################################\n",0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"# 95% confidence intervals in those quantities follow:\n",0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)o,"#######################################################\n",0x38);
    if (this->nBins_ != 0) {
      uVar22 = 0;
      do {
        if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar22] == local_a8._0_4_) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,"#",1);
          uVar19 = 0;
          do {
            if (((this->outputMask_).super__Base_bitset<1UL>._M_w >> (uVar19 & 0x3f) & 1) != 0) {
              std::operator+(&local_c8,"RNEMD detected a numerical error writing: ",
                             &(this->data_).
                              super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19].title);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_c8);
              puVar16 = (ulong *)(plVar13 + 2);
              if ((ulong *)*plVar13 == puVar16) {
                local_d8 = *puVar16;
                lStack_d0 = plVar13[3];
                local_e8 = &local_d8;
              }
              else {
                local_d8 = *puVar16;
                local_e8 = (ulong *)*plVar13;
              }
              local_e0 = plVar13[1];
              *plVar13 = (long)puVar16;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              cVar8 = '\x01';
              if (9 < uVar22) {
                uVar17 = uVar22;
                cVar7 = '\x04';
                do {
                  cVar8 = cVar7;
                  uVar15 = (uint)uVar17;
                  if (uVar15 < 100) {
                    cVar8 = cVar8 + -2;
                    goto LAB_0027ce1f;
                  }
                  if (uVar15 < 1000) {
                    cVar8 = cVar8 + -1;
                    goto LAB_0027ce1f;
                  }
                  if (uVar15 < 10000) goto LAB_0027ce1f;
                  uVar17 = (uVar17 & 0xffffffff) / 10000;
                  cVar7 = cVar8 + '\x04';
                } while (99999 < uVar15);
                cVar8 = cVar8 + '\x01';
              }
LAB_0027ce1f:
              local_108 = local_f8;
              std::__cxx11::string::_M_construct((ulong)&local_108,cVar8);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_108,local_100,(uint)uVar22);
              uVar17 = 0xf;
              if (local_e8 != &local_d8) {
                uVar17 = local_d8;
              }
              uVar2 = CONCAT44(uStack_fc,local_100) + local_e0;
              if (uVar17 < uVar2) {
                uVar17 = 0xf;
                if (local_108 != local_f8) {
                  uVar17 = local_f8[0];
                }
                if (uVar17 < uVar2) goto LAB_0027ce8a;
                puVar14 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
              }
              else {
LAB_0027ce8a:
                puVar14 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108);
              }
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 == paVar1) {
                local_128.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                local_128.field_2._8_8_ = puVar14[3];
              }
              else {
                local_128.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                local_128._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_128._M_string_length = puVar14[1];
              *puVar14 = paVar1;
              puVar14[1] = 0;
              paVar1->_M_local_buf[0] = '\0';
              if (local_108 != local_f8) {
                operator_delete(local_108,local_f8[0] + 1);
              }
              if (local_e8 != &local_d8) {
                operator_delete(local_e8,local_d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              plVar13 = *(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl + uVar22 * 8);
              (**(code **)(*plVar13 + 0x50))(plVar13,o,&local_128,0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != 9);
          local_128._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,(char *)&local_128,1);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < this->nBins_);
    }
    std::ostream::flush();
    std::ofstream::close();
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void RNEMD::writeOutputFile() {
    if (!doRNEMD_) return;
    if (!hasData_) return;

#ifdef IS_MPI
    // If we're the primary node, should we print out the results
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    if (worldRank == 0) {
#endif
      rnemdFile_.open(rnemdFileName_.c_str(), std::ios::out | std::ios::trunc);

      if (!rnemdFile_) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Could not open \"%s\" for RNEMD output.\n",
                 rnemdFileName_.c_str());
        painCave.isFatal = 1;
        simError();
      }

      RealType time    = currentSnap_->getTime();
      RealType avgArea = areaAccumulator_.getAverage();

      RealType Jz(0.0);
      Vector3d JzP(V3Zero);
      Vector3d JzL(V3Zero);
      RealType Jpart(0.0);

      if (time >= info_->getSimParams()->getDt()) {
        Jz    = kineticExchange_ / (time * avgArea) / Constants::energyConvert;
        JzP   = momentumExchange_ / (time * avgArea);
        JzL   = angularMomentumExchange_ / (time * avgArea);
        Jpart = particleExchange_ / (time * avgArea);
      }

      rnemdFile_ << "#######################################################\n";
      rnemdFile_ << "# RNEMD {\n";
      rnemdFile_ << "#    exchangeMethod  = \"" << rnemdMethodLabel_ << "\";\n";
      rnemdFile_ << "#    fluxType  = \"" << rnemdFluxTypeLabel_ << "\";\n";

      if (usePeriodicBoundaryConditions_)
        rnemdFile_ << "#    privilegedAxis = " << rnemdAxisLabel_ << ";\n";

      rnemdFile_ << "#    exchangeTime = " << exchangeTime_ << ";\n";
      rnemdFile_ << "#    objectSelection = \"" << rnemdObjectSelection_
                 << "\";\n";
      rnemdFile_ << "#    selectionA = \"" << selectionA_ << "\";\n";
      rnemdFile_ << "#    selectionB = \"" << selectionB_ << "\";\n";
      rnemdFile_ << "#    outputSelection = \"" << outputSelection_ << "\";\n";
      rnemdFile_ << "# }\n";
      rnemdFile_ << "#######################################################\n";
      rnemdFile_ << "# RNEMD report:\n";
      rnemdFile_ << "#      running time = " << time << " fs\n";
      rnemdFile_ << "# Target flux:\n";
      rnemdFile_ << "#           kinetic = "
                 << kineticFlux_ / Constants::energyConvert
                 << " (kcal/mol/A^2/fs)\n";
      rnemdFile_ << "#          momentum = " << momentumFluxVector_
                 << " (amu/A/fs^2)\n";
      rnemdFile_ << "#  angular momentum = " << angularMomentumFluxVector_
                 << " (amu/A^2/fs^2)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << particleFlux_
                   << " (electrons/A^2/fs)\n";
      } else {
        rnemdFile_ << "#          particle = " << particleFlux_
                   << " (particles/A^2/fs)\n";
      }

      rnemdFile_ << "# Target one-time exchanges:\n";
      rnemdFile_ << "#          kinetic = "
                 << kineticTarget_ / Constants::energyConvert
                 << " (kcal/mol)\n";
      rnemdFile_ << "#          momentum = " << momentumTarget_
                 << " (amu*A/fs)\n";
      rnemdFile_ << "#  angular momentum = " << angularMomentumTarget_
                 << " (amu*A^2/fs)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << particleTarget_
                   << " (electrons)\n";
      } else {
        rnemdFile_ << "#          particle = " << particleTarget_
                   << " (particles)\n";
      }

      rnemdFile_ << "# Actual exchange totals:\n";
      rnemdFile_ << "#          kinetic = "
                 << kineticExchange_ / Constants::energyConvert
                 << " (kcal/mol)\n";
      rnemdFile_ << "#          momentum = " << momentumExchange_
                 << " (amu*A/fs)\n";
      rnemdFile_ << "#  angular momentum = " << angularMomentumExchange_
                 << " (amu*A^2/fs)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << particleExchange_
                   << " (electrons)\n";
      } else {
        rnemdFile_ << "#          particle = " << particleExchange_
                   << " (particles)\n";
      }

      rnemdFile_ << "# Actual flux:\n";
      rnemdFile_ << "#          kinetic = " << Jz << " (kcal/mol/A^2/fs)\n";
      rnemdFile_ << "#          momentum = " << JzP << " (amu/A/fs^2)\n";
      rnemdFile_ << "#  angular momentum = " << JzL << " (amu/A^2/fs^2)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << Jpart
                   << " (electrons/A^2/fs)\n";
      } else {
        rnemdFile_ << "#          particle = " << Jpart
                   << " (particles/A^2/fs)\n";
      }

      rnemdFile_ << "# Exchange statistics:\n";
      rnemdFile_ << "#               attempted = " << trialCount_ << "\n";
      rnemdFile_ << "#                  failed = " << failTrialCount_ << "\n";
      if (rnemdMethodLabel_ == "NIVS") {
        rnemdFile_ << "#  NIVS root-check errors = " << failRootCount_ << "\n";
      }
      rnemdFile_ << "#######################################################\n";

      // write title
      rnemdFile_ << "#";
      for (unsigned int i = 0; i < outputMask_.size(); ++i) {
        if (outputMask_[i]) {
          rnemdFile_ << "\t" << data_[i].title << "(" << data_[i].units << ")";

          // add some extra tabs for column alignment
          if (data_[i].accumulator[0]->getType() ==
              std::type_index(typeid(Vector3d))) {
            rnemdFile_ << "\t\t";
          }

          if (data_[i].accumulator[0]->getType() ==
              std::type_index(typeid(std::vector<RealType>))) {
            rnemdFile_ << "(";
            for (unsigned int type = 0; type < outputTypes_.size(); type++) {
              rnemdFile_ << outputTypes_[type]->getName() << "\t";
            }
            rnemdFile_ << ")\t";
          }
        }
      }

      rnemdFile_ << '\n';

      std::vector<int> nonEmptyAccumulators(nBins_);
      int numberOfAccumulators {};

      for (unsigned int i = 0; i < outputMask_.size(); ++i) {
        if (outputMask_[i]) {
          for (unsigned int bin = 0; bin < nBins_; bin++) {
            nonEmptyAccumulators[bin] +=
                static_cast<int>(data_[i].accumulator[bin]->getCount() != 0);
          }

          numberOfAccumulators++;
        }
      }

      rnemdFile_.precision(8);

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        if (nonEmptyAccumulators[bin] == numberOfAccumulators) {
          for (unsigned int i = 0; i < outputMask_.size(); ++i) {
            if (outputMask_[i]) {
              std::string message =
                  "RNEMD detected a numerical error writing: " +
                  data_[i].title + " for bin " + std::to_string(bin);

              data_[i].accumulator[bin]->writeData(rnemdFile_, message);
            }
          }

          rnemdFile_ << '\n';
        }
      }

      rnemdFile_ << "#######################################################\n";
      rnemdFile_ << "# 95% confidence intervals in those quantities follow:\n";
      rnemdFile_ << "#######################################################\n";

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        if (nonEmptyAccumulators[bin] == numberOfAccumulators) {
          rnemdFile_ << "#";

          for (unsigned int i = 0; i < outputMask_.size(); ++i) {
            if (outputMask_[i]) {
              std::string message =
                  "RNEMD detected a numerical error writing: " +
                  data_[i].title + " std. dev. for bin " + std::to_string(bin);

              data_[i].accumulator[bin]->writeErrorBars(rnemdFile_, message);
            }
          }

          rnemdFile_ << '\n';
        }
      }

      rnemdFile_.flush();
      rnemdFile_.close();
#ifdef IS_MPI
    }
#endif
  }

  void RNEMD::setKineticFlux(RealType kineticFlux) {
    // convert the kcal / mol / Angstroms^2 / fs values in the md file
    // into  amu / fs^3:
    kineticFlux_ = kineticFlux * Constants::energyConvert;
  }

  void RNEMD::setParticleFlux(RealType particleFlux) {
    RealType area = getDefaultDividingArea();

    particleFlux_   = particleFlux;
    particleTarget_ = particleFlux_ * exchangeTime_ * area;
  }

  void RNEMD::setMomentumFluxVector(
      const std::vector<RealType>& momentumFluxVector) {
    if (momentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "momentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               momentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    momentumFluxVector_.x() = momentumFluxVector[0];
    momentumFluxVector_.y() = momentumFluxVector[1];
    momentumFluxVector_.z() = momentumFluxVector[2];
  }

  void RNEMD::setAngularMomentumFluxVector(
      const std::vector<RealType>& angularMomentumFluxVector) {
    if (angularMomentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "angularMomentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               angularMomentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    angularMomentumFluxVector_.x() = angularMomentumFluxVector[0];
    angularMomentumFluxVector_.y() = angularMomentumFluxVector[1];
    angularMomentumFluxVector_.z() = angularMomentumFluxVector[2];
  }

  void RNEMD::parseOutputFileFormat(const std::string& format) {
    if (!doRNEMD_) return;
    StringTokenizer tokenizer(format, " ,;|\t\n\r");

    while (tokenizer.hasMoreTokens()) {
      std::string token(tokenizer.nextToken());
      toUpper(token);
      OutputMapType::iterator i = outputMap_.find(token);
      if (i != outputMap_.end()) {
        outputMask_.set(i->second);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::parseOutputFileFormat: %s is not a recognized\n"
                 "\toutputFileFormat keyword.\n",
                 token.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
    }
  }

  std::string RNEMD::setSelection(RealType& slabCenter) {
    bool printSlabCenterWarning {false};

    Vector3d tempSlabCenter {V3Zero};
    tempSlabCenter[rnemdPrivilegedAxis_] = slabCenter;

    RealType hmat_2 = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) / 2.0;

    if (slabCenter > hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    } else if (slabCenter < -hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    }

    if (printSlabCenterWarning) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "The given slab center was set to %0.2f. In the wrapped "
               "coordinates\n"
               "\t[-Hmat/2, +Hmat/2], this has been remapped to %0.2f.\n",
               slabCenter, tempSlabCenter[rnemdPrivilegedAxis_]);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();

      slabCenter = tempSlabCenter[rnemdPrivilegedAxis_];
    }

    Vector3d leftSlab {V3Zero};
    const RealType& leftSlabBoundary = leftSlab[rnemdPrivilegedAxis_];
    leftSlab[rnemdPrivilegedAxis_]   = slabCenter - 0.5 * slabWidth_;
    currentSnap_->wrapVector(leftSlab);

    Vector3d rightSlab {V3Zero};
    const RealType& rightSlabBoundary = rightSlab[rnemdPrivilegedAxis_];
    rightSlab[rnemdPrivilegedAxis_]   = slabCenter + 0.5 * slabWidth_;
    currentSnap_->wrapVector(rightSlab);

    std::ostringstream selectionStream;

    selectionStream << "select wrapped" << rnemdAxisLabel_
                    << " >= " << leftSlabBoundary;

    if (leftSlabBoundary > rightSlabBoundary)
      selectionStream << " || wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;
    else
      selectionStream << " && wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;

    return selectionStream.str();
  }

  RealType RNEMD::getDefaultDividingArea() {
    if (hasDividingArea_) return dividingArea_;

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (hasSelectionA_) {
      if (evaluatorA_.hasSurfaceArea()) {
        areaA_   = evaluatorA_.getSurfaceArea();
        volumeA_ = evaluatorA_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> aSites;
        seleManA_.setSelectionSet(evaluatorA_.evaluate());
        for (sd = seleManA_.beginSelected(isd); sd != NULL;
             sd = seleManA_.nextSelected(isd)) {
          aSites.push_back(sd);
        }
#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshA = new ConvexHull();
        surfaceMeshA->computeHull(aSites);
        areaA_   = surfaceMeshA->getArea();
        volumeA_ = surfaceMeshA->getVolume();
        delete surfaceMeshA;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaA_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaA_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaA_ = 2.0 * snap->getXYarea();
        }

        volumeA_ = areaA_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, the sphere radius sets the surface area of the
        // dividing surface:
        areaA_   = 4.0 * Constants::PI * std::pow(sphereARadius_, 2);
        volumeA_ = 4.0 * Constants::PI * std::pow(sphereARadius_, 3) / 3.0;
      }
    }

    if (hasSelectionB_) {
      if (evaluatorB_.hasSurfaceArea()) {
        areaB_   = evaluatorB_.getSurfaceArea();
        volumeB_ = evaluatorB_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> bSites;
        seleManB_.setSelectionSet(evaluatorB_.evaluate());
        for (sd = seleManB_.beginSelected(isd); sd != NULL;
             sd = seleManB_.nextSelected(isd)) {
          bSites.push_back(sd);
        }

#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshB = new ConvexHull();
        surfaceMeshB->computeHull(bSites);
        areaB_   = surfaceMeshB->getArea();
        volumeB_ = surfaceMeshB->getVolume();
        delete surfaceMeshB;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaB_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaB_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaB_ = 2.0 * snap->getXYarea();
        }

        volumeB_ = areaB_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, but if a sphereBradius has been set, just use that:
        areaB_ = 4.0 * Constants::PI * pow(sphereBRadius_, 2);
        Thermo thermo(info_);
        RealType hVol = thermo.getHullVolume();
        volumeB_ = hVol - 4.0 * Constants::PI * pow(sphereBRadius_, 3) / 3.0;
      }
    }

    dividingArea_    = min(areaA_, areaB_);
    hasDividingArea_ = true;
    return dividingArea_;
  }

  int RNEMD::getBin(Vector3d pos) {
    if (usePeriodicBoundaryConditions_) {
      currentSnap_->wrapVector(pos);

      return int(nBins_ *
                 (pos[rnemdPrivilegedAxis_] /
                      hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) +
                  0.5)) %
             nBins_;
    } else {
      Vector3d rPos = pos - coordinateOrigin_;
      return int(rPos.length() / binWidth_);
    }
  }
}